

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  int tok;
  
  tok = (int)((ulong)in_RAX >> 0x20);
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 - 0xd8 < 4) {
LAB_0048bc95:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    goto LAB_0048bcc2;
  }
  if (bVar1 - 0xdc < 4) goto LAB_0048bcc2;
  if (bVar1 == 0) {
    cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
    if (cVar2 == '\x05') {
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      goto LAB_0048bcc2;
    }
    if (cVar2 == '\x06') {
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
      goto LAB_0048bcc2;
    }
    if (cVar2 == '\a') goto LAB_0048bc95;
    if ((cVar2 != '\x16') && (cVar2 != '\x18')) {
      if (cVar2 != '\x1d') goto LAB_0048bcc2;
      goto LAB_0048bbab;
    }
  }
  else {
    if ((bVar1 == 0xff) && (0xfd < (byte)ptr[1])) goto LAB_0048bcc2;
LAB_0048bbab:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) == 0) {
LAB_0048bcc2:
      *nextTokPtr = ptr;
      return 0;
    }
  }
  pbVar5 = (byte *)(ptr + 4);
  lVar4 = (long)end - (long)ptr;
  while( true ) {
    lVar4 = lVar4 + -2;
    pbVar6 = pbVar5 + -2;
    if (pbVar6 == (byte *)end) {
      return -1;
    }
    bVar1 = *pbVar6;
    if (bVar1 == 0) break;
    if (bVar1 == 0xff) {
      if (0xfd < pbVar5[-1]) goto switchD_0048bc85_caseD_8;
    }
    else {
      if (bVar1 - 0xd8 < 4) goto switchD_0048bc85_caseD_7;
      if (bVar1 - 0xdc < 4) goto switchD_0048bc85_caseD_8;
    }
switchD_0048bc85_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(pbVar5[-1] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)
                  ) >> (pbVar5[-1] & 0x1f) & 1) == 0) goto switchD_0048bc85_caseD_8;
switchD_0048bc85_caseD_16:
    pbVar5 = pbVar5 + 2;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar5[-1])) {
  case 5:
    if (lVar4 < 2) {
      return -2;
    }
    goto LAB_0048be23;
  case 6:
    if (lVar4 < 3) {
      return -2;
    }
LAB_0048be23:
    *nextTokPtr = (char *)(pbVar5 + -2);
    return 0;
  case 7:
switchD_0048bc85_caseD_7:
    if (lVar4 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)(pbVar5 + -2),(char *)&tok,
                               (int *)&switchD_0048bc85::switchdataD_0056c77c);
    if (iVar3 == 0) {
      *nextTokPtr = (char *)(pbVar5 + -2);
      return 0;
    }
    do {
      while( true ) {
        pbVar6 = pbVar5;
        if (pbVar6 == (byte *)end) {
          return -1;
        }
        bVar1 = *pbVar6;
        if (3 < bVar1 - 0xd8) break;
switchD_0048bd77_caseD_7:
        if ((long)end - (long)pbVar6 < 4) {
          return -2;
        }
        pbVar5 = pbVar6 + 4;
      }
      if (bVar1 != 0) {
        if (bVar1 == 0xff) {
          if (0xfd < pbVar6[1]) goto switchD_0048bd77_caseD_0;
        }
        else if (bVar1 - 0xdc < 4) {
switchD_0048bd77_caseD_0:
          *nextTokPtr = (char *)pbVar6;
          return 0;
        }
        goto switchD_0048bd77_caseD_2;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar6[1])) {
      case 0:
      case 1:
      case 8:
        goto switchD_0048bd77_caseD_0;
      case 5:
        if ((long)end - (long)pbVar6 < 2) {
          return -2;
        }
      default:
switchD_0048bd77_caseD_2:
        pbVar5 = pbVar6 + 2;
        break;
      case 6:
        if ((long)end - (long)pbVar6 < 3) {
          return -2;
        }
        pbVar5 = pbVar6 + 3;
        break;
      case 7:
        goto switchD_0048bd77_caseD_7;
      case 0xf:
        pbVar5 = pbVar6 + 2;
        if (pbVar5 == (byte *)end) {
          return -1;
        }
        if ((*pbVar5 == 0) && (pbVar6[3] == 0x3e)) {
          *nextTokPtr = (char *)(pbVar6 + 4);
          return tok;
        }
      }
    } while( true );
  case 0xf:
    iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)(pbVar5 + -2),(char *)&tok,
                               (int *)&switchD_0048bc85::switchdataD_0056c77c);
    if (iVar3 == 0) {
      *nextTokPtr = (char *)(pbVar5 + -2);
      return 0;
    }
    if (pbVar5 == (byte *)end) {
      return -1;
    }
    pbVar6 = pbVar5;
    if ((*pbVar5 == 0) && (pbVar5[1] == 0x3e)) {
      *nextTokPtr = (char *)(pbVar5 + 2);
      return tok;
    }
    break;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0048bc85_caseD_16;
  case 0x1d:
    goto switchD_0048bc85_caseD_1d;
  }
switchD_0048bc85_caseD_8:
  *nextTokPtr = (char *)pbVar6;
  return 0;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}